

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O3

void gen_m16adds64_q(DisasContext_conflict14 *ctx,TCGv_i32 rl,TCGv_i32 rh,TCGv_i32 arg1_low,
                    TCGv_i32 arg1_high,TCGv_i32 arg2,TCGv_i32 arg3,uint32_t n)

{
  TCGTemp *a1;
  TCGTemp *pTVar1;
  TCGTemp *ts;
  uintptr_t o_2;
  TCGv_i32 ret;
  uintptr_t o_3;
  TCGv_i32 ret_00;
  uintptr_t o_1;
  uintptr_t o;
  TCGv_i64 ret_01;
  TCGTemp *local_48;
  TCGTemp *local_40;
  TCGTemp *local_38;
  
  a1 = tcg_temp_new_internal_tricore((TCGContext_conflict9 *)ctx,TCG_TYPE_I32,false);
  ret = (TCGv_i32)((long)a1 - (long)ctx);
  pTVar1 = tcg_temp_new_internal_tricore((TCGContext_conflict9 *)ctx,TCG_TYPE_I32,false);
  ret_00 = (TCGv_i32)((long)pTVar1 - (long)ctx);
  pTVar1 = tcg_temp_new_internal_tricore((TCGContext_conflict9 *)ctx,TCG_TYPE_I64,false);
  ts = tcg_temp_new_internal_tricore((TCGContext_conflict9 *)ctx,TCG_TYPE_I64,false);
  if (n == 0) {
    tcg_gen_op3_tricore((TCGContext_conflict9 *)ctx,INDEX_op_mul_i32,(TCGArg)a1,
                        (TCGArg)(arg2 + (long)ctx),(TCGArg)(arg3 + (long)ctx));
  }
  else {
    tcg_gen_op3_tricore((TCGContext_conflict9 *)ctx,INDEX_op_mul_i32,(TCGArg)a1,
                        (TCGArg)(arg2 + (long)ctx),(TCGArg)(arg3 + (long)ctx));
    tcg_gen_shli_i32_tricore((TCGContext_conflict9 *)ctx,ret,ret,1);
    tcg_gen_setcondi_i32_tricore((TCGContext_conflict9 *)ctx,TCG_COND_EQ,ret_00,ret,-0x80000000);
    tcg_gen_sub_i32((TCGContext_conflict9 *)ctx,ret,ret,ret_00);
  }
  ret_01 = (TCGv_i64)((long)ts - (long)ctx);
  tcg_gen_ext_i32_i64_tricore((TCGContext_conflict9 *)ctx,ret_01,ret);
  tcg_gen_shli_i64_tricore((TCGContext_conflict9 *)ctx,ret_01,ret_01,0x10);
  tcg_gen_concat_i32_i64_tricore
            ((TCGContext_conflict9 *)ctx,(TCGv_i64)((long)pTVar1 - (long)ctx),arg1_low,arg1_high);
  local_48 = (TCGTemp *)((long)&(ctx->base).tb + *(long *)&ctx[0x19c].opcode);
  local_40 = pTVar1;
  local_38 = ts;
  tcg_gen_callN_tricore((TCGContext_conflict9 *)ctx,helper_add64_ssov,pTVar1,3,&local_48);
  tcg_gen_extr_i64_i32_tricore
            ((TCGContext_conflict9 *)ctx,rl,rh,(TCGv_i64)((long)pTVar1 - (long)ctx));
  tcg_temp_free_internal_tricore((TCGContext_conflict9 *)ctx,(TCGTemp *)(ret + (long)ctx));
  tcg_temp_free_internal_tricore((TCGContext_conflict9 *)ctx,(TCGTemp *)(ret_00 + (long)ctx));
  tcg_temp_free_internal_tricore((TCGContext_conflict9 *)ctx,pTVar1);
  tcg_temp_free_internal_tricore((TCGContext_conflict9 *)ctx,ts);
  return;
}

Assistant:

static inline void
gen_m16adds64_q(DisasContext *ctx, TCGv rl, TCGv rh, TCGv arg1_low, TCGv arg1_high, TCGv arg2,
               TCGv arg3, uint32_t n)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;

    TCGv temp = tcg_temp_new(tcg_ctx);
    TCGv temp2 = tcg_temp_new(tcg_ctx);
    TCGv_i64 t1 = tcg_temp_new_i64(tcg_ctx);
    TCGv_i64 t2 = tcg_temp_new_i64(tcg_ctx);

    if (n == 0) {
        tcg_gen_mul_tl(tcg_ctx, temp, arg2, arg3);
    } else { /* n is expected to be 1 */
        tcg_gen_mul_tl(tcg_ctx, temp, arg2, arg3);
        tcg_gen_shli_tl(tcg_ctx, temp, temp, 1);
        /* catch special case r1 = r2 = 0x8000 */
        tcg_gen_setcondi_tl(tcg_ctx, TCG_COND_EQ, temp2, temp, 0x80000000);
        tcg_gen_sub_tl(tcg_ctx, temp, temp, temp2);
    }
    tcg_gen_ext_i32_i64(tcg_ctx, t2, temp);
    tcg_gen_shli_i64(tcg_ctx, t2, t2, 16);
    tcg_gen_concat_i32_i64(tcg_ctx, t1, arg1_low, arg1_high);

    gen_helper_add64_ssov(tcg_ctx, t1, tcg_ctx->cpu_env, t1, t2);
    tcg_gen_extr_i64_i32(tcg_ctx, rl, rh, t1);

    tcg_temp_free(tcg_ctx, temp);
    tcg_temp_free(tcg_ctx, temp2);
    tcg_temp_free_i64(tcg_ctx, t1);
    tcg_temp_free_i64(tcg_ctx, t2);
}